

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_paeth_predictor_32x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  int iVar23;
  uint8_t *puVar24;
  bool bVar25;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar26 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  __m128i l16;
  __m128i bl;
  __m128i ah;
  __m128i al;
  __m128i tl16;
  __m128i bh;
  
  auVar26 = *(undefined1 (*) [16])above;
  auVar2 = *(undefined1 (*) [16])(above + 0x10);
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar26._0_13_;
  auVar3[0xe] = auVar26[7];
  auVar5[0xc] = auVar26[6];
  auVar5._0_12_ = auVar26._0_12_;
  auVar5._13_2_ = auVar3._13_2_;
  auVar7[0xb] = 0;
  auVar7._0_11_ = auVar26._0_11_;
  auVar7._12_3_ = auVar5._12_3_;
  auVar9[10] = auVar26[5];
  auVar9._0_10_ = auVar26._0_10_;
  auVar9._11_4_ = auVar7._11_4_;
  auVar11[9] = 0;
  auVar11._0_9_ = auVar26._0_9_;
  auVar11._10_5_ = auVar9._10_5_;
  auVar13[8] = auVar26[4];
  auVar13._0_8_ = auVar26._0_8_;
  auVar13._9_6_ = auVar11._9_6_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar13._8_7_;
  auVar19._1_8_ = SUB158(auVar17 << 0x40,7);
  auVar19[0] = auVar26[3];
  auVar19._9_6_ = 0;
  auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar20[0] = auVar26[2];
  auVar20._11_4_ = 0;
  auVar15[2] = auVar26[1];
  auVar15._0_2_ = auVar26._0_2_;
  auVar15._3_12_ = SUB1512(auVar20 << 0x20,3);
  al[0]._0_2_ = auVar26._0_2_ & 0xff;
  al._2_13_ = auVar15._2_13_;
  al[1]._7_1_ = 0;
  ah[0] = (ulong)CONCAT16(auVar26[0xb],
                          (uint6)CONCAT14(auVar26[10],(uint)CONCAT12(auVar26[9],(ushort)auVar26[8]))
                         );
  ah[1]._0_1_ = auVar26[0xc];
  ah[1]._1_1_ = 0;
  ah[1]._2_1_ = auVar26[0xd];
  ah[1]._3_1_ = 0;
  ah[1]._4_1_ = auVar26[0xe];
  ah[1]._5_1_ = 0;
  ah[1]._6_1_ = auVar26[0xf];
  ah[1]._7_1_ = 0;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar2._0_13_;
  auVar4[0xe] = auVar2[7];
  auVar6[0xc] = auVar2[6];
  auVar6._0_12_ = auVar2._0_12_;
  auVar6._13_2_ = auVar4._13_2_;
  auVar8[0xb] = 0;
  auVar8._0_11_ = auVar2._0_11_;
  auVar8._12_3_ = auVar6._12_3_;
  auVar10[10] = auVar2[5];
  auVar10._0_10_ = auVar2._0_10_;
  auVar10._11_4_ = auVar8._11_4_;
  auVar12[9] = 0;
  auVar12._0_9_ = auVar2._0_9_;
  auVar12._10_5_ = auVar10._10_5_;
  auVar14[8] = auVar2[4];
  auVar14._0_8_ = auVar2._0_8_;
  auVar14._9_6_ = auVar12._9_6_;
  auVar18._7_8_ = 0;
  auVar18._0_7_ = auVar14._8_7_;
  auVar21._1_8_ = SUB158(auVar18 << 0x40,7);
  auVar21[0] = auVar2[3];
  auVar21._9_6_ = 0;
  auVar22._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar22[0] = auVar2[2];
  auVar22._11_4_ = 0;
  auVar16[2] = auVar2[1];
  auVar16._0_2_ = auVar2._0_2_;
  auVar16._3_12_ = SUB1512(auVar22 << 0x20,3);
  bl[0]._0_2_ = auVar2._0_2_ & 0xff;
  bl._2_13_ = auVar16._2_13_;
  bl[1]._7_1_ = 0;
  bh[0] = (ulong)CONCAT16(auVar2[0xb],
                          (uint6)CONCAT14(auVar2[10],(uint)CONCAT12(auVar2[9],(ushort)auVar2[8])));
  bh[1]._0_1_ = auVar2[0xc];
  bh[1]._1_1_ = 0;
  bh[1]._2_1_ = auVar2[0xd];
  bh[1]._3_1_ = 0;
  bh[1]._4_1_ = auVar2[0xe];
  bh[1]._5_1_ = 0;
  bh[1]._6_1_ = auVar2[0xf];
  bh[1]._7_1_ = 0;
  auVar26 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  tl16[0]._0_4_ = auVar26._0_4_;
  uVar1 = *(ulong *)left;
  puVar24 = dst + 0x10;
  iVar23 = 8;
  auVar26 = _DAT_00434880;
  tl16[0]._4_4_ = (undefined4)tl16[0];
  tl16[1]._0_4_ = (undefined4)tl16[0];
  tl16[1]._4_4_ = (undefined4)tl16[0];
  while (bVar25 = iVar23 != 0, iVar23 = iVar23 + -1, bVar25) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    l16 = (__m128i)pshufb(auVar2,auVar26);
    paeth_16x1_pred(&l16,&al,&ah,&tl16);
    paeth_16x1_pred(&l16,&bl,&bh,&tl16);
    local_a8 = auVar26._0_2_;
    sStack_a6 = auVar26._2_2_;
    sStack_a4 = auVar26._4_2_;
    sStack_a2 = auVar26._6_2_;
    sStack_a0 = auVar26._8_2_;
    sStack_9e = auVar26._10_2_;
    sStack_9c = auVar26._12_2_;
    sStack_9a = auVar26._14_2_;
    *(undefined8 *)(puVar24 + -0x10) = extraout_XMM0_Qa;
    *(undefined8 *)(puVar24 + -8) = extraout_XMM0_Qb;
    *(undefined8 *)puVar24 = extraout_XMM0_Qa_00;
    *(undefined8 *)(puVar24 + 8) = extraout_XMM0_Qb_00;
    auVar26._0_2_ = local_a8 + 1;
    auVar26._2_2_ = sStack_a6 + 1;
    auVar26._4_2_ = sStack_a4 + 1;
    auVar26._6_2_ = sStack_a2 + 1;
    auVar26._8_2_ = sStack_a0 + 1;
    auVar26._10_2_ = sStack_9e + 1;
    auVar26._12_2_ = sStack_9c + 1;
    auVar26._14_2_ = sStack_9a + 1;
    puVar24 = puVar24 + stride;
  }
  return;
}

Assistant:

void aom_paeth_predictor_32x8_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  const __m128i l = _mm_loadl_epi64((const __m128i *)left);
  __m128i l16;

  for (int i = 0; i < 8; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}